

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O2

string * __thiscall
Json::JsonParser::parseString_abi_cxx11_(string *__return_storage_ptr__,JsonParser *this,char prev)

{
  JsonReader *this_00;
  char cVar1;
  bool bVar2;
  byte bVar3;
  JsonException *pJVar4;
  JsonParser *this_01;
  string hex_oct;
  
  (this->__buffer_value)._M_string_length = 0;
  *(this->__buffer_value)._M_dataplus._M_p = '\0';
  buffer_append(this,prev);
  this_00 = &this->__reader;
  while( true ) {
    while( true ) {
      cVar1 = JsonReader::get(this_00);
      if (cVar1 != '\\') break;
      if (this->__escape == false) {
        buffer_append(this,'\\');
        cVar1 = JsonReader::get(this_00);
        goto LAB_001084bf;
      }
      cVar1 = JsonReader::get(this_00);
      this_01 = (JsonParser *)(ulong)(uint)(int)cVar1;
      bVar2 = is_escape(cVar1);
      if (bVar2) {
        cVar1 = convert2escape(this_01,cVar1);
        goto LAB_001084bf;
      }
      if (cVar1 == 'x' || (byte)(cVar1 - 0x30U) < 10) {
        resolve_escape_number_abi_cxx11_(&hex_oct,this,cVar1);
        if (hex_oct._M_string_length == 0) {
          pJVar4 = (JsonException *)__cxa_allocate_exception(0x50);
          JsonException::JsonException(pJVar4,this_00);
          __cxa_throw(pJVar4,&JsonException::typeinfo,JsonException::~JsonException);
        }
        std::__cxx11::string::append((char *)this);
      }
      else {
        if (cVar1 != 'u') {
          pJVar4 = (JsonException *)__cxa_allocate_exception(0x50);
          JsonException::JsonException(pJVar4,this_00);
          goto LAB_001085db;
        }
        resolve_escape_hex_unicode_abi_cxx11_(&hex_oct,this);
        if (hex_oct._M_string_length == 0) {
          pJVar4 = (JsonException *)__cxa_allocate_exception(0x50);
          JsonException::JsonException(pJVar4,this_00);
          __cxa_throw(pJVar4,&JsonException::typeinfo,JsonException::~JsonException);
        }
        std::__cxx11::string::append((char *)this);
      }
      std::__cxx11::string::~string((string *)&hex_oct);
    }
    if (cVar1 == '\"') break;
LAB_001084bf:
    buffer_append(this,cVar1);
  }
  buffer_append(this,'\"');
  while( true ) {
    cVar1 = JsonReader::peek(this_00);
    if (cVar1 == ',') break;
    bVar2 = is_normal_char(cVar1);
    if (bVar2) break;
    bVar3 = JsonReader::get(this_00);
    if ((0x20 < bVar3) || ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
      pJVar4 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(pJVar4,this_00);
LAB_001085db:
      __cxa_throw(pJVar4,&JsonException::typeinfo,JsonException::~JsonException);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(this->__buffer_value)._M_dataplus._M_p,
             (allocator<char> *)&hex_oct);
  return __return_storage_ptr__;
}

Assistant:

std::string Json::JsonParser::parseString(char prev) {
    buffer_reset();
    buffer_append(prev);
    for (;;) {
        char s = __reader.get();
        if (s == '\\') {
            if (!__escape) {
                buffer_append('\\');
                buffer_append(__reader.get());
                continue;
            }
            char sn = __reader.get();
            if (is_escape(sn)) {
                buffer_append(convert2escape(sn));
                // parse hex string
            } else if (sn == 'x' || is_number(sn)) {
                std::string hex_oct = resolve_escape_number(sn);
                if (hex_oct.empty()) throw JsonException(__reader);
                buffer_append(hex_oct.c_str());
                // parse unicode string
            } else if (sn == 'u') {
                std::string unicodeS = resolve_escape_hex_unicode();
                if (unicodeS.empty()) throw JsonException(__reader);
                buffer_append(unicodeS.c_str());
            } else throw JsonException(__reader);
        } else if (s == '\"') {
            buffer_append('\"');
            for (;;) {
                char c = __reader.peek();
                if (c == JSON_SEPARATE || JsonParser::is_normal_char(c)) {
                    break;
                } else if (is_space_char(__reader.get()))continue;
                else throw JsonException(__reader);
            }
            break;
        } else buffer_append(s);
    }
    return buffer_str();
}